

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

bool __thiscall
testing::internal::OnCallSpec<int_(int,_int)>::Matches
          (OnCallSpec<int_(int,_int)> *this,ArgumentTuple *args)

{
  bool bVar1;
  undefined1 uVar2;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<int>,testing::Matcher<int>>,std::tuple<int,int>>
                    ((tuple<testing::Matcher<int>,_testing::Matcher<int>_> *)(this + 0x10),args);
  if (bVar1) {
    uVar2 = (**(code **)(**(long **)(this + 0x48) + 0x20))(*(long **)(this + 0x48),args);
  }
  else {
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }